

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O0

void update_box(j_decompress_ptr cinfo,boxptr boxp)

{
  _func_void_j_decompress_ptr *p_Var1;
  long lVar2;
  long lVar3;
  long lVar4;
  long ccount;
  JLONG dist2;
  JLONG dist1;
  JLONG dist0;
  int c2max;
  int c2min;
  int c1max;
  int c1min;
  int c0max;
  int c0min;
  int c2;
  int c1;
  int c0;
  histptr histp;
  hist3d histogram;
  my_cquantize_ptr_conflict cquantize;
  boxptr boxp_local;
  j_decompress_ptr cinfo_local;
  
  p_Var1 = cinfo->cquantize[1].finish_pass;
  c0min = boxp->c0min;
  c0max = boxp->c0max;
  c1min = boxp->c1min;
  c1max = boxp->c1max;
  c2min = boxp->c2min;
  c2max = boxp->c2max;
  c0 = c0min;
  if (c0min < c0max) {
    for (; c1 = c1min, c0 <= c0max; c0 = c0 + 1) {
      for (; c1 <= c1max; c1 = c1 + 1) {
        histp = (histptr)(*(long *)(p_Var1 + (long)c0 * 8) + (long)c1 * 0x40 + (long)c2min * 2);
        for (c2 = c2min; c2 <= c2max; c2 = c2 + 1) {
          if (*histp != 0) {
            c0min = c0;
            boxp->c0min = c0;
            goto LAB_001493e7;
          }
          histp = histp + 1;
        }
      }
    }
  }
LAB_001493e7:
  c0 = c0max;
  if (c0min < c0max) {
    for (; c1 = c1min, c0min <= c0; c0 = c0 + -1) {
      for (; c1 <= c1max; c1 = c1 + 1) {
        histp = (histptr)(*(long *)(p_Var1 + (long)c0 * 8) + (long)c1 * 0x40 + (long)c2min * 2);
        for (c2 = c2min; c2 <= c2max; c2 = c2 + 1) {
          if (*histp != 0) {
            c0max = c0;
            boxp->c0max = c0;
            goto LAB_001494bf;
          }
          histp = histp + 1;
        }
      }
    }
  }
LAB_001494bf:
  c1 = c1min;
  if (c1min < c1max) {
    for (; c1 <= c1max; c1 = c1 + 1) {
      for (c0 = c0min; c0 <= c0max; c0 = c0 + 1) {
        histp = (histptr)(*(long *)(p_Var1 + (long)c0 * 8) + (long)c1 * 0x40 + (long)c2min * 2);
        for (c2 = c2min; c2 <= c2max; c2 = c2 + 1) {
          if (*histp != 0) {
            c1min = c1;
            boxp->c1min = c1;
            goto LAB_00149597;
          }
          histp = histp + 1;
        }
      }
    }
  }
LAB_00149597:
  c1 = c1max;
  if (c1min < c1max) {
    for (; c1min <= c1; c1 = c1 + -1) {
      for (c0 = c0min; c0 <= c0max; c0 = c0 + 1) {
        histp = (histptr)(*(long *)(p_Var1 + (long)c0 * 8) + (long)c1 * 0x40 + (long)c2min * 2);
        for (c2 = c2min; c2 <= c2max; c2 = c2 + 1) {
          if (*histp != 0) {
            c1max = c1;
            boxp->c1max = c1;
            goto LAB_0014966f;
          }
          histp = histp + 1;
        }
      }
    }
  }
LAB_0014966f:
  c2 = c2min;
  if (c2min < c2max) {
    for (; c2 <= c2max; c2 = c2 + 1) {
      for (c0 = c0min; c0 <= c0max; c0 = c0 + 1) {
        histp = (histptr)(*(long *)(p_Var1 + (long)c0 * 8) + (long)c1min * 0x40 + (long)c2 * 2);
        for (c1 = c1min; c1 <= c1max; c1 = c1 + 1) {
          if (*histp != 0) {
            c2min = c2;
            boxp->c2min = c2;
            goto LAB_00149749;
          }
          histp = histp + 0x20;
        }
      }
    }
  }
LAB_00149749:
  c2 = c2max;
  if (c2min < c2max) {
    for (; c2min <= c2; c2 = c2 + -1) {
      for (c0 = c0min; c0 <= c0max; c0 = c0 + 1) {
        histp = (histptr)(*(long *)(p_Var1 + (long)c0 * 8) + (long)c1min * 0x40 + (long)c2 * 2);
        for (c1 = c1min; c1 <= c1max; c1 = c1 + 1) {
          if (*histp != 0) {
            c2max = c2;
            boxp->c2max = c2;
            goto LAB_00149823;
          }
          histp = histp + 0x20;
        }
      }
    }
  }
LAB_00149823:
  lVar2 = (long)((c0max - c0min) * 8 * c_scales[rgb_red[cinfo->out_color_space]]);
  lVar3 = (long)((c1max - c1min) * 4 * c_scales[rgb_green[cinfo->out_color_space]]);
  lVar4 = (long)((c2max - c2min) * 8 * c_scales[rgb_blue[cinfo->out_color_space]]);
  boxp->volume = lVar2 * lVar2 + lVar3 * lVar3 + lVar4 * lVar4;
  ccount = 0;
  for (c0 = c0min; c0 <= c0max; c0 = c0 + 1) {
    for (c1 = c1min; c1 <= c1max; c1 = c1 + 1) {
      histp = (histptr)(*(long *)(p_Var1 + (long)c0 * 8) + (long)c1 * 0x40 + (long)c2min * 2);
      for (c2 = c2min; c2 <= c2max; c2 = c2 + 1) {
        if (*histp != 0) {
          ccount = ccount + 1;
        }
        histp = histp + 1;
      }
    }
  }
  boxp->colorcount = ccount;
  return;
}

Assistant:

LOCAL(void)
update_box(j_decompress_ptr cinfo, boxptr boxp)
/* Shrink the min/max bounds of a box to enclose only nonzero elements, */
/* and recompute its volume and population */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  hist3d histogram = cquantize->histogram;
  histptr histp;
  int c0, c1, c2;
  int c0min, c0max, c1min, c1max, c2min, c2max;
  JLONG dist0, dist1, dist2;
  long ccount;

  c0min = boxp->c0min;  c0max = boxp->c0max;
  c1min = boxp->c1min;  c1max = boxp->c1max;
  c2min = boxp->c2min;  c2max = boxp->c2max;

  if (c0max > c0min)
    for (c0 = c0min; c0 <= c0max; c0++)
      for (c1 = c1min; c1 <= c1max; c1++) {
        histp = &histogram[c0][c1][c2min];
        for (c2 = c2min; c2 <= c2max; c2++)
          if (*histp++ != 0) {
            boxp->c0min = c0min = c0;
            goto have_c0min;
          }
      }
have_c0min:
  if (c0max > c0min)
    for (c0 = c0max; c0 >= c0min; c0--)
      for (c1 = c1min; c1 <= c1max; c1++) {
        histp = &histogram[c0][c1][c2min];
        for (c2 = c2min; c2 <= c2max; c2++)
          if (*histp++ != 0) {
            boxp->c0max = c0max = c0;
            goto have_c0max;
          }
      }
have_c0max:
  if (c1max > c1min)
    for (c1 = c1min; c1 <= c1max; c1++)
      for (c0 = c0min; c0 <= c0max; c0++) {
        histp = &histogram[c0][c1][c2min];
        for (c2 = c2min; c2 <= c2max; c2++)
          if (*histp++ != 0) {
            boxp->c1min = c1min = c1;
            goto have_c1min;
          }
      }
have_c1min:
  if (c1max > c1min)
    for (c1 = c1max; c1 >= c1min; c1--)
      for (c0 = c0min; c0 <= c0max; c0++) {
        histp = &histogram[c0][c1][c2min];
        for (c2 = c2min; c2 <= c2max; c2++)
          if (*histp++ != 0) {
            boxp->c1max = c1max = c1;
            goto have_c1max;
          }
      }
have_c1max:
  if (c2max > c2min)
    for (c2 = c2min; c2 <= c2max; c2++)
      for (c0 = c0min; c0 <= c0max; c0++) {
        histp = &histogram[c0][c1min][c2];
        for (c1 = c1min; c1 <= c1max; c1++, histp += HIST_C2_ELEMS)
          if (*histp != 0) {
            boxp->c2min = c2min = c2;
            goto have_c2min;
          }
      }
have_c2min:
  if (c2max > c2min)
    for (c2 = c2max; c2 >= c2min; c2--)
      for (c0 = c0min; c0 <= c0max; c0++) {
        histp = &histogram[c0][c1min][c2];
        for (c1 = c1min; c1 <= c1max; c1++, histp += HIST_C2_ELEMS)
          if (*histp != 0) {
            boxp->c2max = c2max = c2;
            goto have_c2max;
          }
      }
have_c2max:

  /* Update box volume.
   * We use 2-norm rather than real volume here; this biases the method
   * against making long narrow boxes, and it has the side benefit that
   * a box is splittable iff norm > 0.
   * Since the differences are expressed in histogram-cell units,
   * we have to shift back to JSAMPLE units to get consistent distances;
   * after which, we scale according to the selected distance scale factors.
   */
  dist0 = ((c0max - c0min) << C0_SHIFT) * C0_SCALE;
  dist1 = ((c1max - c1min) << C1_SHIFT) * C1_SCALE;
  dist2 = ((c2max - c2min) << C2_SHIFT) * C2_SCALE;
  boxp->volume = dist0 * dist0 + dist1 * dist1 + dist2 * dist2;

  /* Now scan remaining volume of box and compute population */
  ccount = 0;
  for (c0 = c0min; c0 <= c0max; c0++)
    for (c1 = c1min; c1 <= c1max; c1++) {
      histp = &histogram[c0][c1][c2min];
      for (c2 = c2min; c2 <= c2max; c2++, histp++)
        if (*histp != 0) {
          ccount++;
        }
    }
  boxp->colorcount = ccount;
}